

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

void enet_peer_dispatch_incoming_reliable_commands
               (ENetPeer *peer,ENetChannel *channel,ENetIncomingCommand *queuedCommand)

{
  ENetIncomingCommand *incomingCommand;
  ENetListIterator currentCommand;
  ENetIncomingCommand *queuedCommand_local;
  ENetChannel *channel_local;
  ENetPeer *peer_local;
  
  for (incomingCommand = (ENetIncomingCommand *)(channel->incomingReliableCommands).sentinel.next;
      ((incomingCommand != (ENetIncomingCommand *)&channel->incomingReliableCommands &&
       (incomingCommand->fragmentsRemaining == 0)) &&
      (incomingCommand->reliableSequenceNumber ==
       (uint16_t)(channel->incomingReliableSequenceNumber + 1)));
      incomingCommand = (ENetIncomingCommand *)(incomingCommand->incomingCommandList).next) {
    channel->incomingReliableSequenceNumber = incomingCommand->reliableSequenceNumber;
    if (incomingCommand->fragmentCount != 0) {
      channel->incomingReliableSequenceNumber =
           channel->incomingReliableSequenceNumber + (short)incomingCommand->fragmentCount + -1;
    }
  }
  if (incomingCommand != (ENetIncomingCommand *)(channel->incomingReliableCommands).sentinel.next) {
    channel->incomingUnreliableSequenceNumber = 0;
    enet_list_move(&(peer->dispatchedCommands).sentinel,
                   (channel->incomingReliableCommands).sentinel.next,
                   (incomingCommand->incomingCommandList).previous);
    if (peer->needsDispatch == 0) {
      enet_list_insert(&(peer->host->dispatchQueue).sentinel,peer);
      peer->needsDispatch = 1;
    }
    if ((channel->incomingUnreliableCommands).sentinel.next !=
        &(channel->incomingUnreliableCommands).sentinel) {
      enet_peer_dispatch_incoming_unreliable_commands(peer,channel,queuedCommand);
    }
  }
  return;
}

Assistant:

void enet_peer_dispatch_incoming_reliable_commands(ENetPeer* peer, ENetChannel* channel, ENetIncomingCommand* queuedCommand) {
	ENetListIterator currentCommand;

	for (currentCommand = enet_list_begin(&channel->incomingReliableCommands); currentCommand != enet_list_end(&channel->incomingReliableCommands); currentCommand = enet_list_next(currentCommand)) {
		ENetIncomingCommand* incomingCommand = (ENetIncomingCommand*)currentCommand;

		if (incomingCommand->fragmentsRemaining > 0 || incomingCommand->reliableSequenceNumber != (uint16_t)(channel->incomingReliableSequenceNumber + 1))
			break;

		channel->incomingReliableSequenceNumber = incomingCommand->reliableSequenceNumber;

		if (incomingCommand->fragmentCount > 0)
			channel->incomingReliableSequenceNumber += incomingCommand->fragmentCount - 1;
	}

	if (currentCommand == enet_list_begin(&channel->incomingReliableCommands))
		return;

	channel->incomingUnreliableSequenceNumber = 0;

	enet_list_move(enet_list_end(&peer->dispatchedCommands), enet_list_begin(&channel->incomingReliableCommands), enet_list_previous(currentCommand));

	if (!peer->needsDispatch) {
		enet_list_insert(enet_list_end(&peer->host->dispatchQueue), &peer->dispatchList);

		peer->needsDispatch = 1;
	}

	if (!enet_list_empty(&channel->incomingUnreliableCommands))
		enet_peer_dispatch_incoming_unreliable_commands(peer, channel, queuedCommand);
}